

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::WhileStmt::~WhileStmt(WhileStmt *this)

{
  WhileStmt *this_local;
  
  ~WhileStmt(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~WhileStmt(){
       delete condition;
       condition = nullptr;
       delete body;
       body = nullptr;
    }